

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O2

error eval_expr(atom expr,atom env,atom *result)

{
  uint uVar1;
  undefined4 uVar2;
  anon_union_8_9_1d3277aa_for_value aVar3;
  pair *ppVar4;
  long lVar5;
  uint *puVar6;
  char *pcVar7;
  int saved_size;
  str *psVar8;
  error in_EAX;
  error eVar9;
  int iVar10;
  anon_union_8_9_1d3277aa_for_value aVar11;
  type tVar12;
  anon_union_8_9_1d3277aa_for_value aVar13;
  atom *paVar14;
  type tVar15;
  atom a;
  atom expr_00;
  atom expr_01;
  atom expr_02;
  atom parent;
  atom env_00;
  atom expr_03;
  atom fn_00;
  atom env_01;
  atom expr_04;
  atom env_02;
  atom env_03;
  atom env_04;
  atom env_05;
  atom env_06;
  atom env_07;
  atom arg_names;
  atom env_08;
  atom env_09;
  atom args_00;
  atom args_01;
  atom v;
  atom item;
  atom a_00;
  atom a_01;
  atom a_02;
  atom aVar16;
  atom body;
  atom body_00;
  atom value;
  uint local_10c;
  atom args;
  atom fn;
  atom r;
  vector vargs;
  
  saved_size = (int)stack_size;
  aVar11 = env.value;
  aVar13 = expr.value;
  tVar12 = env.type;
  aVar16._0_8_ = (ulong)expr.type;
  do {
    tVar15 = (type)aVar16._0_8_;
    a.value.number = aVar13.number;
    a._0_8_ = aVar16._0_8_;
    stack_add(a);
    aVar16._0_8_ = CONCAT44(0,tVar12);
    aVar16.value.number = aVar11.number;
    stack_add(aVar16);
    consider_gc();
    if (tVar15 != T_CONS) {
      if (tVar15 != T_SYM) {
        result->type = tVar15;
        *(uint *)&result->field_0x4 = local_10c;
        (result->value).fp = (FILE *)aVar13;
        return ERROR_OK;
      }
      env_01.value.number = aVar11.number;
      env_01._0_8_ = aVar16._0_8_;
      eVar9 = env_get(env_01,aVar13.symbol,result);
      err_expr.type = T_SYM;
      err_expr._4_4_ = local_10c;
      err_expr.value = aVar13;
      return eVar9;
    }
    tVar15 = ((aVar13.pair)->car).type;
    expr_00._4_4_ = 0;
    expr_00.type = tVar15;
    aVar3 = (anon_union_8_9_1d3277aa_for_value)(aVar13.fp)->_IO_read_ptr;
    args._0_8_ = (*aVar13.jb)[0].__jmpbuf[2];
    args.value = (anon_union_8_9_1d3277aa_for_value)(aVar13.fp)->_IO_read_base;
    psVar8 = (str *)args._0_8_;
    if (tVar15 == T_SYM) {
      if (sym_if.value.pair == aVar3.pair) {
        paVar14 = &args;
        while( true ) {
          if (paVar14->type == T_NIL) {
            *(undefined8 *)result = 0;
            (result->value).number = 0.0;
            eVar9 = ERROR_OK;
            aVar16._0_8_ = 0;
            aVar13.number = 0.0;
            goto LAB_00105460;
          }
          ppVar4 = (paVar14->value).pair;
          aVar16._0_8_ = CONCAT44(0,(ppVar4->car).type);
          if ((ppVar4->cdr).type == T_NIL) {
            local_10c = *(uint *)&(ppVar4->car).field_0x4;
            aVar13 = (anon_union_8_9_1d3277aa_for_value)(ppVar4->car).value.fp;
            goto LAB_001053cf;
          }
          env_07._4_4_ = 0;
          env_07.type = tVar12;
          expr_02.value.pair = (ppVar4->car).value.pair;
          expr_02._0_8_ = aVar16._0_8_;
          env_07.value.number = aVar11.number;
          eVar9 = eval_expr(expr_02,env_07,(atom *)&vargs);
          if (eVar9 != ERROR_OK) goto LAB_00105399;
          puVar6 = (uint *)((paVar14->value).fp)->_IO_read_base;
          if ((int)vargs.data != 0) break;
          paVar14 = (atom *)(puVar6 + 4);
        }
        aVar16._0_8_ = (ulong)*puVar6;
        local_10c = puVar6[1];
        aVar13 = (anon_union_8_9_1d3277aa_for_value)
                 ((anon_union_8_9_1d3277aa_for_value *)(puVar6 + 2))->fp;
LAB_001053cf:
        iVar10 = 2;
      }
      else {
        if (sym_assign.value.pair == aVar3.pair) {
          if ((args.type != T_NIL) && (*(int *)&((FILE *)args.value.pair)->_IO_read_end != 0)) {
            if (((FILE *)args.value.pair)->_flags != 2) {
LAB_00105607:
              args._0_8_ = psVar8;
              stack_restore(saved_size);
              return ERROR_TYPE;
            }
            pcVar7 = (args.value.fp)->_IO_read_ptr;
            expr_04._0_8_ = CONCAT44(0,*(uint *)(args.value.fp)->_IO_read_base);
            env_09._4_4_ = 0;
            env_09.type = tVar12;
            expr_04.value.pair =
                 ((anon_union_8_9_1d3277aa_for_value *)((long)(args.value.fp)->_IO_read_base + 8))->
                 pair;
            env_09.value.number = aVar11.number;
            args._0_8_ = psVar8;
            eVar9 = eval_expr(expr_04,env_09,(atom *)&vargs);
            if (eVar9 != ERROR_OK) {
LAB_001055d6:
              stack_restore(saved_size);
              return eVar9;
            }
            *(atom **)result = vargs.data;
            result->value = (anon_union_8_9_1d3277aa_for_value)vargs.static_data[0]._0_8_;
            value._0_8_ = (ulong)vargs.data & 0xffffffff;
            env_02.value.number = aVar11.number;
            env_02._0_8_ = expr_04._0_8_;
            value.value = (anon_union_8_9_1d3277aa_for_value)vargs.static_data[0]._0_8_;
            env_assign_eq(env_02,pcVar7,value);
            tVar12 = result->type;
            aVar13 = (anon_union_8_9_1d3277aa_for_value)(result->value).pair;
            eVar9 = ERROR_OK;
LAB_0010557c:
            aVar16._0_8_ = (ulong)tVar12;
LAB_00105460:
            a_01.value.number = aVar13.number;
            a_01._0_8_ = aVar16._0_8_;
            stack_restore_add(saved_size,a_01);
            return eVar9;
          }
LAB_001055e0:
          args._0_8_ = psVar8;
          stack_restore(saved_size);
          return ERROR_ARGS;
        }
        if (sym_quote.value.pair == aVar3.pair) {
          if ((args.type != T_NIL) && (*(int *)&((FILE *)args.value.pair)->_IO_read_end == 0)) {
            uVar2 = *(undefined4 *)&((FILE *)args.value.pair)->field_0x4;
            aVar13 = (anon_union_8_9_1d3277aa_for_value)(args.value.fp)->_IO_read_ptr;
            result->type = ((FILE *)args.value.pair)->_flags;
            *(undefined4 *)&result->field_0x4 = uVar2;
            result->value = aVar13;
            tVar12 = result->type;
            aVar13 = (anon_union_8_9_1d3277aa_for_value)(result->value).pair;
            args._0_8_ = psVar8;
LAB_00105533:
            a_02._4_4_ = 0;
            a_02.type = tVar12;
            a_02.value.number = aVar13.number;
            stack_restore_add(saved_size,a_02);
            return ERROR_OK;
          }
          goto LAB_001055e0;
        }
        if (sym_fn.value.pair == aVar3.pair) {
          if (args.type != T_NIL) {
            args_00._4_4_ = 0;
            args_00.type = ((FILE *)args.value.pair)->_flags;
            body._4_4_ = 0;
            body.type = *(uint *)&((FILE *)args.value.pair)->_IO_read_end;
            env_03._4_4_ = 0;
            env_03.type = tVar12;
            env_03.value.number = aVar11.number;
            args_00.value.symbol = (args.value.fp)->_IO_read_ptr;
            body.value.symbol = (args.value.fp)->_IO_read_base;
            args._0_8_ = psVar8;
            eVar9 = make_closure(env_03,args_00,body,result);
            tVar12 = result->type;
            aVar13 = (anon_union_8_9_1d3277aa_for_value)(result->value).pair;
            goto LAB_0010557c;
          }
          goto LAB_001055e0;
        }
        if (sym_do.value.pair != aVar3.pair) {
          if (sym_mac.value.pair == aVar3.pair) {
            if ((args.type != T_NIL) && (*(int *)&((FILE *)args.value.pair)->_IO_read_end != 0)) {
              puVar6 = (uint *)(args.value.fp)->_IO_read_base;
              body_00._4_4_ = 0;
              body_00.type = puVar6[4];
              if (puVar6[4] != 0) {
                if (((FILE *)args.value.pair)->_flags != 2) goto LAB_00105607;
                uVar2 = *(undefined4 *)&((FILE *)args.value.pair)->field_0x4;
                pcVar7 = (args.value.fp)->_IO_read_ptr;
                args_01._4_4_ = 0;
                args_01.type = *puVar6;
                env_04._4_4_ = 0;
                env_04.type = tVar12;
                env_04.value.number = aVar11.number;
                args_01.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(puVar6 + 2))->pair;
                body_00.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(puVar6 + 6))->pair;
                args._0_8_ = psVar8;
                eVar9 = make_closure(env_04,args_01,body_00,(atom *)&vargs);
                if (eVar9 != ERROR_OK) goto LAB_001055d6;
                result->type = T_SYM;
                *(undefined4 *)&result->field_0x4 = uVar2;
                (result->value).symbol = pcVar7;
                v.value = (anon_union_8_9_1d3277aa_for_value)vargs.static_data[0]._0_8_;
                v._0_8_ = 6;
                table_set_sym((table *)(aVar11.fp)->_IO_read_base,pcVar7,v);
                tVar12 = result->type;
                aVar13 = (anon_union_8_9_1d3277aa_for_value)(result->value).pair;
                goto LAB_00105533;
              }
            }
            goto LAB_001055e0;
          }
          goto LAB_00105191;
        }
        while( true ) {
          args._0_8_ = psVar8;
          aVar13 = args.value;
          if (args.type == T_NIL) {
            return ERROR_OK;
          }
          aVar16._0_8_ = CONCAT44(0,((args.value.pair)->car).type);
          if (((args.value.pair)->cdr).type == T_NIL) break;
          env_08._4_4_ = 0;
          env_08.type = tVar12;
          expr_03.value.symbol = (args.value.fp)->_IO_read_ptr;
          expr_03._0_8_ = aVar16._0_8_;
          env_08.value.number = aVar11.number;
          eVar9 = eval_expr(expr_03,env_08,result);
          if (eVar9 != ERROR_OK) {
            return eVar9;
          }
          args.value = (anon_union_8_9_1d3277aa_for_value)(aVar13.fp)->_IO_read_base;
          psVar8 = (aVar13.str)->next;
        }
        local_10c = *(uint *)&((args.value.pair)->car).field_0x4;
        aVar13 = (anon_union_8_9_1d3277aa_for_value)(args.value.fp)->_IO_read_ptr;
        stack_restore(saved_size);
        iVar10 = 2;
      }
    }
    else {
LAB_00105191:
      env_05._4_4_ = 0;
      env_05.type = tVar12;
      expr_00.value.pair = aVar3.pair;
      env_05.value.number = aVar11.number;
      args._0_8_ = psVar8;
      eVar9 = eval_expr(expr_00,env_05,&fn);
      if (eVar9 == ERROR_OK) {
        vargs.capacity = 8;
        vargs.size = 0;
        vargs.data = vargs.static_data;
        paVar14 = &args;
LAB_001051d7:
        if (paVar14->type != T_NIL) {
          expr_01._4_4_ = 0;
          expr_01.type = ((paVar14->value).fp)->_flags;
          env_06._4_4_ = 0;
          env_06.type = tVar12;
          expr_01.value.symbol = ((paVar14->value).fp)->_IO_read_ptr;
          env_06.value.number = aVar11.number;
          eVar9 = eval_expr(expr_01,env_06,&r);
          if (eVar9 == ERROR_OK) break;
          vector_free(&vargs);
LAB_00105399:
          stack_restore(saved_size);
          goto LAB_001053a5;
        }
        fn_00._4_4_ = 0;
        fn_00.type = fn.type;
        if (fn.type == T_CLOSURE) {
          uVar1 = *(uint *)(fn.value.fp)->_IO_read_base;
          aVar3 = (anon_union_8_9_1d3277aa_for_value)
                  ((anon_union_8_9_1d3277aa_for_value *)((long)(fn.value.fp)->_IO_read_base + 8))->
                  pair;
          parent._4_4_ = 0;
          parent.type = ((fn.value.pair)->car).type;
          parent.value.symbol = (fn.value.fp)->_IO_read_ptr;
          aVar16 = env_create(parent);
          aVar11 = aVar16.value;
          lVar5 = (*fn.value.jb)[0].__jmpbuf[3];
          aVar16._0_8_ = (ulong)*(uint *)(lVar5 + 0x10);
          local_10c = *(uint *)(lVar5 + 0x14);
          aVar13 = (anon_union_8_9_1d3277aa_for_value)
                   ((anon_union_8_9_1d3277aa_for_value *)(lVar5 + 0x18))->fp;
          arg_names._4_4_ = 0;
          arg_names.type = uVar1;
          env_00.value.number = aVar11.number;
          env_00._0_8_ = 1;
          arg_names.value =
               (anon_union_8_9_1d3277aa_for_value)(anon_union_8_9_1d3277aa_for_value)aVar3.pair;
          eVar9 = env_bind(env_00,arg_names,&vargs);
          if (eVar9 != ERROR_OK) {
            tVar12 = T_CONS;
            in_EAX = eVar9;
            goto LAB_001053aa;
          }
          vector_free(&vargs);
          stack_restore(saved_size);
          iVar10 = 2;
          tVar12 = T_CONS;
        }
        else {
          fn_00.value.number = fn.value.number;
          in_EAX = apply(fn_00,&vargs,result);
          vector_free(&vargs);
          a_00._4_4_ = 0;
          a_00.type = result->type;
          a_00.value.pair = (result->value).pair;
          stack_restore_add(saved_size,a_00);
          aVar16._0_8_ = 1;
          iVar10 = 1;
        }
      }
      else {
        stack_restore(saved_size);
LAB_001053a5:
        aVar16._0_8_ = 1;
        in_EAX = eVar9;
LAB_001053aa:
        iVar10 = 1;
      }
    }
    if (iVar10 != 2) {
      return in_EAX;
    }
  } while( true );
  item._4_4_ = 0;
  item.type = r.type;
  item.value.number = r.value.number;
  vector_add(&vargs,item);
  paVar14 = &((paVar14->value).pair)->cdr;
  goto LAB_001051d7;
}

Assistant:

error eval_expr(atom expr, atom env, atom *result)
{
	error err;
	int ss = stack_size; /* save stack point */
start_eval:
	stack_add(expr);
	stack_add(env);
	consider_gc();
	if (expr.type == T_SYM) {
		err = env_get(env, expr.value.symbol, result);
		err_expr = expr;
		return err;
	}
	else if (expr.type != T_CONS) {
		*result = expr;
		return ERROR_OK;
	}
	else {
		atom op = car(expr);
		atom args = cdr(expr);

		if (op.type == T_SYM) {
			/* Handle special forms */
			if (op.value.symbol == sym_if.value.symbol) {
				atom *p = &args;
				while (!no(*p)) {
					atom cond;
					if (no(cdr(*p))) { /* else */
						/* tail call optimization of else part */
						expr = car(*p);
						goto start_eval;
					}
					err = eval_expr(car(*p), env, &cond);
					if (err) {
						stack_restore(ss);
						return err;
					}
					if (!no(cond)) { /* then */
						/* tail call optimization of err = eval_expr(car(cdr(*p)), env, result); */
						expr = car(cdr(*p));
						goto start_eval;
					}
					p = &cdr(cdr(*p));
				}
				*result = nil;
				stack_restore_add(ss, *result);
				return ERROR_OK;
			}
			else if (op.value.symbol == sym_assign.value.symbol) {
				atom sym;
				if (no(args) || no(cdr(args))) {
					stack_restore(ss);
					return ERROR_ARGS;
				}

				sym = car(args);
				if (sym.type == T_SYM) {
					atom val;
					err = eval_expr(car(cdr(args)), env, &val);
					if (err) {
						stack_restore(ss);
						return err;
					}

					*result = val;
					err = env_assign_eq(env, sym.value.symbol, val);
					stack_restore_add(ss, *result);
					return err;
				}
				else {
					stack_restore(ss);
					return ERROR_TYPE;
				}
			}
			else if (op.value.symbol == sym_quote.value.symbol) {
				if (no(args) || !no(cdr(args))) {
					stack_restore(ss);
					return ERROR_ARGS;
				}

				*result = car(args);
				stack_restore_add(ss, *result);
				return ERROR_OK;
			}
			else if (op.value.symbol == sym_fn.value.symbol) {
				if (no(args)) {
					stack_restore(ss);
					return ERROR_ARGS;
				}
				err = make_closure(env, car(args), cdr(args), result);
				stack_restore_add(ss, *result);
				return err;
			}
			else if (op.value.symbol == sym_do.value.symbol) {
				/* Evaluate the body */
				while (!no(args)) {
					if (no(cdr(args))) {
						/* tail call */
						expr = car(args);
						stack_restore(ss);
						goto start_eval;
					}
					error err = eval_expr(car(args), env, result);
					if (err) {
						return err;
					}
					args = cdr(args);
				}
				return ERROR_OK;
			}
			else if (op.value.symbol == sym_mac.value.symbol) { /* (mac name (arg ...) body) */
				atom name, macro;

				if (no(args) || no(cdr(args)) || no(cdr(cdr(args)))) {
					stack_restore(ss);
					return ERROR_ARGS;
				}

				name = car(args);
				if (name.type != T_SYM) {
					stack_restore(ss);
					return ERROR_TYPE;
				}

				err = make_closure(env, car(cdr(args)), cdr(cdr(args)), &macro);
				if (!err) {
					macro.type = T_MACRO;
					*result = name;
					err = env_assign(env, name.value.symbol, macro);
					stack_restore_add(ss, *result);
					return err;
				}
				else {
					stack_restore(ss);
					return err;
				}
			}
		}

		/* Evaluate operator */
		atom fn;
		err = eval_expr(op, env, &fn);
		if (err) {
			stack_restore(ss);
			return err;
		}

		/* Evaulate arguments */
		struct vector vargs;
		vector_new(&vargs);
		atom *p = &args;
		while (!no(*p)) {
			atom r;
			err = eval_expr(car(*p), env, &r);
			if (err) {
				vector_free(&vargs);
				stack_restore(ss);
				return err;
			}
			vector_add(&vargs, r);
			p = &cdr(*p);
		}

		/* tail call optimization of err = apply(fn, args, result); */
		if (fn.type == T_CLOSURE) {
			atom arg_names = car(cdr(fn));
			env = env_create(car(fn));
			expr = cdr(cdr(fn));

			/* Bind the arguments */
			err = env_bind(env, arg_names, &vargs);
			if (err) {
				return err;
			}
			vector_free(&vargs);
			stack_restore(ss);
			goto start_eval;
		}
		else {
			err = apply(fn, &vargs, result);
			vector_free(&vargs);
		}
		stack_restore_add(ss, *result);
		return err;
	}
}